

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coomatrix.h
# Opt level: O3

void __thiscall
lf::assemble::COOMatrix<double>::AddToEntry
          (COOMatrix<double> *this,gdof_idx_t i,gdof_idx_t j,double increment)

{
  pointer *ppTVar1;
  iterator __position;
  uint uVar2;
  uint uVar3;
  Triplet<double,_int> local_10;
  
  local_10.m_row = (int)i;
  uVar2 = local_10.m_row + 1;
  if (i < (long)(ulong)this->rows_) {
    uVar2 = this->rows_;
  }
  local_10.m_col = (int)j;
  uVar3 = local_10.m_col + 1;
  if (j < (long)(ulong)this->cols_) {
    uVar3 = this->cols_;
  }
  this->rows_ = uVar2;
  this->cols_ = uVar3;
  __position._M_current =
       (this->triplets_).
       super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->triplets_).
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.m_value = increment;
    std::vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>>::
    _M_realloc_insert<Eigen::Triplet<double,int>>
              ((vector<Eigen::Triplet<double,int>,std::allocator<Eigen::Triplet<double,int>>> *)
               &this->triplets_,__position,&local_10);
  }
  else {
    (__position._M_current)->m_row = local_10.m_row;
    (__position._M_current)->m_col = local_10.m_col;
    (__position._M_current)->m_value = increment;
    ppTVar1 = &(this->triplets_).
               super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppTVar1 = *ppTVar1 + 1;
  }
  return;
}

Assistant:

void AddToEntry(gdof_idx_t i, gdof_idx_t j, SCALAR increment) {
    rows_ = (i + 1 > rows_) ? i + 1 : rows_;
    cols_ = (j + 1 > cols_) ? j + 1 : cols_;
    triplets_.push_back(Eigen::Triplet<SCALAR>(i, j, increment));
  }